

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O0

void render_svg(element_t *element,render_context_t *context,render_state_t *state)

{
  float x_00;
  float y_00;
  float width;
  float height;
  float _h;
  float _w;
  float _y;
  float _x;
  length_t h;
  length_t w;
  length_t y;
  length_t x;
  render_state_t *state_local;
  render_context_t *context_local;
  element_t *element_local;
  
  if (element->parent == (element *)0x0) {
    render_symbol(element,context,state,0.0,0.0,context->document->width,context->document->height);
  }
  else {
    y.value = 0.0;
    y.type = length_type_fixed;
    w.value = 0.0;
    w.type = length_type_fixed;
    h.value = 100.0;
    h.type = length_type_percent;
    _y = 100.0;
    _x = 2.8026e-45;
    parse_length(element,0x2a,&y,true,false);
    parse_length(element,0x2d,&w,true,false);
    parse_length(element,0x29,&h,false,false);
    parse_length(element,0x10,(length_t *)&_y,false,false);
    x_00 = resolve_length(state,&y,'x');
    y_00 = resolve_length(state,&w,'y');
    width = resolve_length(state,&h,'x');
    height = resolve_length(state,(length_t *)&_y,'y');
    render_symbol(element,context,state,x_00,y_00,width,height);
  }
  return;
}

Assistant:

static void render_svg(const element_t* element, const render_context_t* context, render_state_t* state)
{
    if(element->parent == NULL) {
        render_symbol(element, context, state, 0.f, 0.f, context->document->width, context->document->height);
        return;
    }

    length_t x = {0, length_type_fixed};
    length_t y = {0, length_type_fixed};

    length_t w = {100, length_type_percent};
    length_t h = {100, length_type_percent};

    parse_length(element, ATTR_X, &x, true, false);
    parse_length(element, ATTR_Y, &y, true, false);
    parse_length(element, ATTR_WIDTH, &w, false, false);
    parse_length(element, ATTR_HEIGHT, &h, false, false);

    float _x = resolve_length(state, &x, 'x');
    float _y = resolve_length(state, &y, 'y');
    float _w = resolve_length(state, &w, 'x');
    float _h = resolve_length(state, &h, 'y');
    render_symbol(element, context, state, _x, _y, _w, _h);
}